

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O3

IVal * vkt::shaderexecutor::ContainerTraits<tcu::Vector<int,_2>,_tcu::Vector<tcu::Interval,_2>_>::
       doRound(IVal *__return_storage_ptr__,FloatFormat *fmt,Vector<int,_2> *value)

{
  Interval *pIVar1;
  bool bVar2;
  long lVar3;
  bool bVar4;
  Interval local_60;
  Interval local_48;
  
  lVar3 = 0;
  __return_storage_ptr__->m_data[0].m_hasNaN = false;
  __return_storage_ptr__->m_data[0].m_lo = INFINITY;
  __return_storage_ptr__->m_data[0].m_hi = -INFINITY;
  __return_storage_ptr__->m_data[1].m_hasNaN = false;
  __return_storage_ptr__->m_data[1].m_lo = INFINITY;
  __return_storage_ptr__->m_data[1].m_hi = -INFINITY;
  bVar2 = true;
  do {
    bVar4 = bVar2;
    local_60.m_lo = (double)value->m_data[lVar3];
    local_60.m_hasNaN = false;
    local_60.m_hi = local_60.m_lo;
    tcu::FloatFormat::roundOut(&local_48,fmt,&local_60,false);
    __return_storage_ptr__->m_data[lVar3].m_hi = local_48.m_hi;
    pIVar1 = __return_storage_ptr__->m_data + lVar3;
    pIVar1->m_hasNaN = local_48.m_hasNaN;
    *(undefined7 *)&pIVar1->field_0x1 = local_48._1_7_;
    pIVar1->m_lo = local_48.m_lo;
    lVar3 = 1;
    bVar2 = false;
  } while (bVar4);
  return __return_storage_ptr__;
}

Assistant:

static IVal			doRound			(const FloatFormat& fmt, T value)
	{
		IVal ret;

		for (int ndx = 0; ndx < T::SIZE; ++ndx)
			ret[ndx] = round(fmt, value[ndx]);

		return ret;
	}